

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::TraverseSchema::doTraverseSchema(TraverseSchema *this,DOMElement *schemaRoot)

{
  RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
  *pRVar1;
  XMLCh *pXVar2;
  ValueVectorOf<xercesc_4_0::SchemaElementDecl_*> *pVVar3;
  XMLSize_t XVar4;
  SchemaElementDecl *elemDecl;
  RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>_> *pRVar5;
  ValueVectorOf<xercesc_4_0::DOMElement_*> *this_00;
  XMLSize_t XVar6;
  bool bVar7;
  ulong uVar8;
  SchemaElementDecl **ppSVar9;
  DOMElement **ppDVar10;
  RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_> **ppRVar11;
  RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::DOMElement_*>_> **ppRVar12;
  XMLCh *pXVar13;
  XMLCh XVar14;
  RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_> *pRVar15;
  XMLSize_t getAt;
  XMLSize_t getAt_00;
  
  processChildren(this,schemaRoot);
  pRVar1 = this->fIC_ElementsNS;
  if (pRVar1 != (RefHashTableOf<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>,_xercesc_4_0::StringHasher>
                 *)0x0) {
    pXVar2 = this->fTargetNSURIString;
    if ((pXVar2 == (XMLCh *)0x0) || (uVar8 = (ulong)(ushort)*pXVar2, uVar8 == 0)) {
      uVar8 = 0;
    }
    else {
      XVar14 = pXVar2[1];
      if (XVar14 != L'\0') {
        pXVar13 = pXVar2 + 2;
        do {
          uVar8 = (ulong)(ushort)XVar14 + (uVar8 >> 0x18) + uVar8 * 0x26;
          XVar14 = *pXVar13;
          pXVar13 = pXVar13 + 1;
        } while (XVar14 != L'\0');
      }
      uVar8 = uVar8 % pRVar1->fHashModulus;
    }
    pRVar15 = pRVar1->fBucketList[uVar8];
    if (pRVar15 !=
        (RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_> *)0x0
       ) {
      do {
        bVar7 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,pXVar2,pRVar15->fKey);
        if (bVar7) goto LAB_00324f02;
        pRVar15 = pRVar15->fNext;
      } while (pRVar15 !=
               (RefHashTableBucketElem<xercesc_4_0::ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>_>
                *)0x0);
      if (bVar7) {
LAB_00324f02:
        pXVar2 = this->fTargetNSURIString;
        pRVar1 = this->fIC_ElementsNS;
        if ((pXVar2 == (XMLCh *)0x0) || (uVar8 = (ulong)(ushort)*pXVar2, uVar8 == 0)) {
          uVar8 = 0;
        }
        else {
          XVar14 = pXVar2[1];
          if (XVar14 != L'\0') {
            pXVar13 = pXVar2 + 2;
            do {
              uVar8 = (ulong)(ushort)XVar14 + (uVar8 >> 0x18) + uVar8 * 0x26;
              XVar14 = *pXVar13;
              pXVar13 = pXVar13 + 1;
            } while (XVar14 != L'\0');
          }
          uVar8 = uVar8 % pRVar1->fHashModulus;
        }
        ppRVar11 = pRVar1->fBucketList + uVar8;
        do {
          pRVar15 = *ppRVar11;
          bVar7 = StringHasher::equals((StringHasher *)&pRVar1->field_0x30,pXVar2,pRVar15->fKey);
          ppRVar11 = &pRVar15->fNext;
        } while (!bVar7);
        pVVar3 = pRVar15->fData;
        this->fIC_Elements = pVVar3;
        XVar4 = pVVar3->fCurCount;
        if (XVar4 != 0) {
          getAt_00 = 0;
          do {
            ppSVar9 = ValueVectorOf<xercesc_4_0::SchemaElementDecl_*>::elementAt
                                (this->fIC_Elements,getAt_00);
            elemDecl = *ppSVar9;
            ppRVar12 = this->fIC_NodeListNS->fBucketList +
                       (ulong)elemDecl % this->fIC_NodeListNS->fHashModulus;
            do {
              pRVar5 = *ppRVar12;
              ppRVar12 = &pRVar5->fNext;
            } while ((SchemaElementDecl *)pRVar5->fKey != elemDecl);
            this_00 = pRVar5->fData;
            XVar6 = this_00->fCurCount;
            if (XVar6 != 0) {
              getAt = 0;
              do {
                ppDVar10 = ValueVectorOf<xercesc_4_0::DOMElement_*>::elementAt(this_00,getAt);
                traverseKeyRef(this,*ppDVar10,elemDecl);
                getAt = getAt + 1;
              } while (XVar6 != getAt);
            }
            getAt_00 = getAt_00 + 1;
          } while (getAt_00 != XVar4);
        }
      }
    }
  }
  if ((this->fScanner->fValidateAnnotations == true) &&
     (this->fSchemaGrammar->fAnnotations->fCount != 0)) {
    validateAnnotations(this);
  }
  this->fSchemaInfo->fProcessed = true;
  return;
}

Assistant:

void TraverseSchema::doTraverseSchema(const DOMElement* const schemaRoot) {

    // process children nodes
    processChildren(schemaRoot);

    // Handle identity constraints - keyref
    if (fIC_ElementsNS && fIC_ElementsNS->containsKey(fTargetNSURIString)) {

        fIC_Elements = fIC_ElementsNS->get(fTargetNSURIString);

        XMLSize_t icListSize = fIC_Elements->size();

        for (XMLSize_t i=0; i < icListSize; i++) {

            SchemaElementDecl* curElem = fIC_Elements->elementAt(i);
            ValueVectorOf<DOMElement*>* icNodes =  fIC_NodeListNS->get(curElem);
            XMLSize_t icNodesSize = icNodes->size();

            for (XMLSize_t j = 0; j < icNodesSize; j++) {
                traverseKeyRef(icNodes->elementAt(j), curElem);
            }
        }
    }

    if (fScanner->getValidateAnnotations() && !fSchemaGrammar->getAnnotations()->isEmpty())
    {
        validateAnnotations();
    }
    fSchemaInfo->setProcessed();
}